

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O1

int __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::maxDelta(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *val,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *maxabs,UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *update,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *lowBound,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *upBound,int start,int incr)

{
  cpp_dec_float<200u,int,void> *this_00;
  fpclass_type fVar1;
  int32_t iVar2;
  fpclass_type fVar3;
  fpclass_type fVar4;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar5;
  pointer pnVar6;
  SPxId *pSVar7;
  int32_t iVar8;
  int32_t iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  bool *pbVar13;
  long lVar14;
  int *piVar15;
  int *piVar16;
  long lVar17;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar18;
  pointer pnVar19;
  uint *puVar20;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar21;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *u;
  cpp_dec_float<200u,int,void> *pcVar22;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar23;
  undefined4 *puVar24;
  undefined4 *puVar25;
  uint *puVar26;
  cpp_dec_float<200U,_int,_void> *pcVar27;
  cpp_dec_float<200U,_int,_void> *pcVar28;
  uint *puVar29;
  undefined4 *puVar30;
  cpp_dec_float<200U,_int,_void> *pcVar31;
  byte bVar32;
  long lVar33;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *v;
  long in_FS_OFFSET;
  bool bVar34;
  byte bVar35;
  ulong uVar36;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  undefined1 local_4d8 [32];
  undefined1 local_4b8 [16];
  undefined1 local_4a8 [16];
  undefined1 local_498 [16];
  undefined1 local_488 [16];
  undefined1 local_478 [13];
  undefined3 uStack_46b;
  int iStack_468;
  bool bStack_464;
  ulong local_460;
  int local_44c;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_448;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_440;
  undefined1 local_438 [32];
  undefined1 local_418 [16];
  undefined1 local_408 [16];
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [13];
  undefined3 uStack_3cb;
  int iStack_3c8;
  bool abStack_3c4 [4];
  ulong local_3c0;
  pointer local_3b0;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_3a8;
  Type local_39c;
  undefined1 local_398 [32];
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [13];
  undefined3 uStack_32b;
  int iStack_328;
  bool bStack_324;
  undefined8 local_320;
  fpclass_type *local_318;
  fpclass_type *local_310;
  pointer local_308;
  undefined8 local_300;
  cpp_dec_float<200U,_int,_void> *local_2f8;
  undefined8 uStack_2f0;
  undefined1 local_2e8 [32];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [13];
  undefined3 uStack_27b;
  int iStack_278;
  bool bStack_274;
  undefined8 local_270;
  cpp_dec_float<200U,_int,_void> local_268;
  double local_1e8;
  undefined8 uStack_1e0;
  undefined1 local_1d8 [32];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [13];
  undefined3 uStack_16b;
  int iStack_168;
  bool bStack_164;
  ulong local_160;
  double local_158;
  undefined8 uStack_150;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_148;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_140;
  undefined1 local_138 [32];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [13];
  undefined3 uStack_cb;
  int iStack_c8;
  bool bStack_c4;
  undefined8 local_c0;
  undefined1 local_b8 [32];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [13];
  undefined3 uStack_4b;
  int iStack_48;
  bool bStack_44;
  undefined8 local_40;
  
  bVar35 = 0;
  local_3c0 = 0x1c00000000;
  local_438._0_16_ = (undefined1  [16])0x0;
  local_438._16_16_ = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_3f8 = (undefined1  [16])0x0;
  local_3e8 = (undefined1  [16])0x0;
  local_3d8 = SUB1613((undefined1  [16])0x0,0);
  uStack_3cb = 0;
  iStack_3c8 = 0;
  abStack_3c4[0] = false;
  local_270._0_4_ = cpp_dec_float_finite;
  local_270._4_4_ = 0x1c;
  local_2e8._0_16_ = (undefined1  [16])0x0;
  local_2e8._16_16_ = (undefined1  [16])0x0;
  local_2c8 = (undefined1  [16])0x0;
  local_2b8 = (undefined1  [16])0x0;
  local_2a8 = (undefined1  [16])0x0;
  local_298 = (undefined1  [16])0x0;
  local_288 = SUB1613((undefined1  [16])0x0,0);
  uStack_27b = 0;
  iStack_278 = 0;
  bStack_274 = false;
  local_1d8._0_16_ = (undefined1  [16])0x0;
  local_1d8._16_16_ = (undefined1  [16])0x0;
  local_1b8 = (undefined1  [16])0x0;
  local_1a8 = (undefined1  [16])0x0;
  local_198 = (undefined1  [16])0x0;
  local_188 = (undefined1  [16])0x0;
  local_178 = SUB1613((undefined1  [16])0x0,0);
  uStack_16b = 0;
  local_40._0_4_ = cpp_dec_float_finite;
  local_40._4_4_ = 0x1c;
  local_b8._0_16_ = (undefined1  [16])0x0;
  local_b8._16_16_ = (undefined1  [16])0x0;
  local_98 = (undefined1  [16])0x0;
  local_88 = (undefined1  [16])0x0;
  local_78 = (undefined1  [16])0x0;
  local_68 = (undefined1  [16])0x0;
  local_58 = SUB1613((undefined1  [16])0x0,0);
  uStack_4b = 0;
  iStack_48 = 0;
  bStack_44 = false;
  local_c0._0_4_ = cpp_dec_float_finite;
  local_c0._4_4_ = 0x1c;
  local_138._0_16_ = (undefined1  [16])0x0;
  local_138._16_16_ = (undefined1  [16])0x0;
  local_118 = (undefined1  [16])0x0;
  local_108 = (undefined1  [16])0x0;
  local_f8 = (undefined1  [16])0x0;
  local_e8 = (undefined1  [16])0x0;
  local_d8 = SUB1613((undefined1  [16])0x0,0);
  local_300 = 0;
  uStack_cb = 0;
  iStack_c8 = 0;
  bStack_c4 = false;
  local_39c = (this->
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).m_type;
  if (local_39c != LEAVE) {
    pSVar5 = (this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    local_300 = CONCAT71((int7)((ulong)pSVar5 >> 8),pSVar5->theRep == ROW);
  }
  puVar26 = (uint *)maxabs;
  pcVar28 = &local_268;
  for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
    (pcVar28->data)._M_elems[0] = *puVar26;
    puVar26 = puVar26 + 1;
    pcVar28 = (cpp_dec_float<200U,_int,_void> *)((pcVar28->data)._M_elems + 1);
  }
  local_268.exp = (maxabs->m_backend).exp;
  local_268.neg = (maxabs->m_backend).neg;
  local_268.fpclass = (maxabs->m_backend).fpclass;
  local_268.prec_elem = (maxabs->m_backend).prec_elem;
  local_310 = (fpclass_type *)
              (upBound->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_318 = (fpclass_type *)
              (lowBound->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_3b0 = (update->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *)(update->thedelta).super_IdxSet.idx;
  pnVar6 = (update->thedelta).
           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar26 = (uint *)val;
  puVar20 = (uint *)local_1d8;
  for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
    *puVar20 = *puVar26;
    puVar26 = puVar26 + 1;
    puVar20 = puVar20 + 1;
  }
  iStack_168 = (val->m_backend).exp;
  bStack_164 = (val->m_backend).neg;
  local_160._0_4_ = (val->m_backend).fpclass;
  local_160._4_4_ = (val->m_backend).prec_elem;
  local_140 = maxabs;
  local_148 = val;
  if ((update->thedelta).setupStatus == true) {
    iVar10 = (update->thedelta).super_IdxSet.num;
    local_44c = -1;
    if (start < iVar10) {
      local_440 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar18 + (long)iVar10 * 4);
      piVar16 = (int *)((long)pnVar18 + (long)start * 4);
      local_448 = &this->epsilon;
      u = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)&this->fastDelta;
      puVar26 = local_268.data._M_elems + 1;
      local_158 = *(double *)(in_FS_OFFSET + -8);
      uStack_150 = 0;
      local_2f8 = (cpp_dec_float<200U,_int,_void> *)-*(double *)(in_FS_OFFSET + -8);
      uStack_2f0 = 0x8000000000000000;
      local_308 = (pointer)((long)incr << 2);
      local_44c = -1;
      local_3a8 = u;
      do {
        iVar10 = *piVar16;
        if (local_39c == LEAVE) {
          if (this->iscoid == true) {
            pSVar5 = (this->
                     super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).thesolver;
            iVar11 = pSVar5->theRep *
                     ((pSVar5->
                      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedesc.costat)->data[iVar10];
          }
          else {
            pSVar5 = (this->
                     super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).thesolver;
            iVar11 = pSVar5->theRep *
                     ((pSVar5->
                      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedesc.stat)->data[iVar10];
          }
          if (iVar11 < 1) goto LAB_005c81b2;
          goto LAB_005c87e8;
        }
LAB_005c81b2:
        local_1e8 = (double)CONCAT44(local_1e8._4_4_,iVar10);
        if ((char)local_300 != '\0') {
          pSVar5 = (this->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver;
          pSVar7 = (pSVar5->
                   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).theBaseId.data;
          if (0 < pSVar7[iVar10].super_DataKey.info) {
            SPxColId::SPxColId((SPxColId *)local_4d8,pSVar7 + iVar10);
            iVar11 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                     ::number(&(pSVar5->
                               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).
                               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .
                               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .set,(DataKey *)local_4d8);
            if ((pSVar5->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.colstat.data[iVar11] == P_FIXED) goto LAB_005c87e8;
          }
        }
        pnVar19 = pnVar6 + iVar10;
        pcVar28 = (cpp_dec_float<200U,_int,_void> *)local_438;
        for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
          (pcVar28->data)._M_elems[0] = (pnVar19->m_backend).data._M_elems[0];
          pnVar19 = (pointer)((long)pnVar19 + ((ulong)bVar35 * -2 + 1) * 4);
          pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4);
        }
        iStack_3c8 = pnVar6[iVar10].m_backend.exp;
        abStack_3c4[0] = pnVar6[iVar10].m_backend.neg;
        uVar36._0_4_ = pnVar6[iVar10].m_backend.fpclass;
        uVar36._4_4_ = pnVar6[iVar10].m_backend.prec_elem;
        local_3c0 = uVar36;
        pnVar18 = local_448;
        pcVar28 = (cpp_dec_float<200U,_int,_void> *)local_4d8;
        for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
          (pcVar28->data)._M_elems[0] = (pnVar18->m_backend).data._M_elems[0];
          pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar18 + (ulong)bVar35 * -8 + 4);
          pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4);
        }
        iStack_468 = (this->epsilon).m_backend.exp;
        bStack_464 = (this->epsilon).m_backend.neg;
        local_460._0_4_ = (this->epsilon).m_backend.fpclass;
        local_460._4_4_ = (this->epsilon).m_backend.prec_elem;
        if ((fpclass_type)local_460 == cpp_dec_float_NaN || (undefined4)uVar36 == 2) {
LAB_005c8493:
          pnVar18 = local_448;
          pcVar28 = (cpp_dec_float<200U,_int,_void> *)local_4d8;
          for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
            (pcVar28->data)._M_elems[0] = (pnVar18->m_backend).data._M_elems[0];
            pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar18 + (ulong)bVar35 * -8 + 4);
            pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4);
          }
          bStack_464 = (this->epsilon).m_backend.neg;
          iStack_468 = (this->epsilon).m_backend.exp;
          local_460._0_4_ = (this->epsilon).m_backend.fpclass;
          local_460._4_4_ = (this->epsilon).m_backend.prec_elem;
          if (local_4d8._0_4_ != 0 || (fpclass_type)local_460 != 0) {
            bStack_464 = (bool)(bStack_464 ^ 1);
          }
          if ((((fpclass_type)local_460 != 2) && ((fpclass_type)local_3c0 != cpp_dec_float_NaN)) &&
             (iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)local_438,
                                  (cpp_dec_float<200U,_int,_void> *)local_4d8), u = local_3a8,
             iVar11 < 0)) {
            pcVar28 = (cpp_dec_float<200U,_int,_void> *)local_438;
            pcVar27 = (cpp_dec_float<200U,_int,_void> *)local_4d8;
            for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
              (pcVar27->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
              pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4);
              pcVar27 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar27 + (ulong)bVar35 * -8 + 4);
            }
            iStack_468 = iStack_3c8;
            bStack_464 = abStack_3c4[0];
            local_460 = local_3c0;
            if (local_4d8._0_4_ != 0 || (int)local_3c0 != 0) {
              bStack_464 = (bool)(abStack_3c4[0] ^ 1);
            }
            if ((((int)local_3c0 == 2) || (local_268.fpclass == cpp_dec_float_NaN)) ||
               (iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   ((cpp_dec_float<200U,_int,_void> *)local_4d8,&local_268),
               iVar11 < 1)) {
              puVar20 = puVar26;
              puVar29 = (uint *)local_398;
              for (lVar12 = 0x1b; iVar11 = local_268.exp, bVar32 = local_268.neg,
                  uVar36 = local_268._120_8_, lVar12 != 0; lVar12 = lVar12 + -1) {
                *puVar29 = *puVar20;
                puVar20 = puVar20 + (ulong)bVar35 * -2 + 1;
                puVar29 = puVar29 + (ulong)bVar35 * -2 + 1;
              }
            }
            else {
              puVar24 = (undefined4 *)(local_438 + 4);
              puVar25 = (undefined4 *)local_398;
              for (lVar12 = 0x1b; lVar12 != 0; lVar12 = lVar12 + -1) {
                *puVar25 = *puVar24;
                puVar24 = puVar24 + (ulong)bVar35 * -2 + 1;
                puVar25 = puVar25 + (ulong)bVar35 * -2 + 1;
              }
              local_268.data._M_elems[0] = local_438._0_4_;
              iVar11 = iStack_3c8;
              bVar32 = ((int)local_3c0 != 0 || local_438._0_4_ != 0) ^ abStack_3c4[0];
              uVar36 = local_3c0;
            }
            puVar20 = (uint *)local_398;
            puVar29 = puVar26;
            for (lVar12 = 0x1b; lVar12 != 0; lVar12 = lVar12 + -1) {
              *puVar29 = *puVar20;
              puVar20 = puVar20 + (ulong)bVar35 * -2 + 1;
              puVar29 = puVar29 + (ulong)bVar35 * -2 + 1;
            }
            pnVar19 = (pointer)((long)local_318 + (long)iVar10 * 0x80);
            puVar24 = (undefined4 *)local_138;
            for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
              *puVar24 = (pnVar19->m_backend).data._M_elems[0];
              pnVar19 = (pointer)((long)pnVar19 + ((ulong)bVar35 * -2 + 1) * 4);
              puVar24 = puVar24 + (ulong)bVar35 * -2 + 1;
            }
            iStack_c8 = (((pointer)((long)local_318 + (long)iVar10 * 0x80))->m_backend).exp;
            bStack_c4 = (((pointer)((long)local_318 + (long)iVar10 * 0x80))->m_backend).neg;
            local_c0._0_4_ = (((pointer)((long)local_318 + (long)iVar10 * 0x80))->m_backend).fpclass
            ;
            local_c0._4_4_ =
                 (((pointer)((long)local_318 + (long)iVar10 * 0x80))->m_backend).prec_elem;
            local_268.exp = iVar11;
            local_268.neg = (bool)bVar32;
            local_268._120_8_ = uVar36;
            ::soplex::infinity::__tls_init();
            local_460 = 0x1c00000000;
            local_4d8._0_16_ = (undefined1  [16])0x0;
            local_4d8._16_16_ = (undefined1  [16])0x0;
            local_4b8 = (undefined1  [16])0x0;
            local_4a8 = (undefined1  [16])0x0;
            local_498 = (undefined1  [16])0x0;
            local_488 = (undefined1  [16])0x0;
            local_478 = SUB1613((undefined1  [16])0x0,0);
            uStack_46b = 0;
            iStack_468 = 0;
            bStack_464 = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)local_4d8,(double)local_2f8);
            v = local_3a8;
            u = v;
            if (((fpclass_type)local_c0 != cpp_dec_float_NaN) &&
               ((fpclass_type)local_460 != cpp_dec_float_NaN)) {
              iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)local_138,
                                  (cpp_dec_float<200U,_int,_void> *)local_4d8);
              if (0 < iVar11) {
                pcVar28 = &local_3b0[iVar10].m_backend;
                local_460._0_4_ = cpp_dec_float_finite;
                local_460._4_4_ = 0x1c;
                local_4d8._0_16_ = (undefined1  [16])0x0;
                local_4d8._16_16_ = (undefined1  [16])0x0;
                local_4b8 = (undefined1  [16])0x0;
                local_4a8 = (undefined1  [16])0x0;
                local_498 = (undefined1  [16])0x0;
                local_488 = (undefined1  [16])0x0;
                local_478 = SUB1613((undefined1  [16])0x0,0);
                uStack_46b = 0;
                iStack_468 = 0;
                bStack_464 = false;
                if ((cpp_dec_float<200U,_int,_void> *)local_4d8 == pcVar28) {
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                            ((cpp_dec_float<200U,_int,_void> *)local_4d8,
                             (cpp_dec_float<200U,_int,_void> *)local_138);
                  if (local_4d8._0_4_ != 0 || (fpclass_type)local_460 != cpp_dec_float_finite) {
                    bStack_464 = (bool)(bStack_464 ^ 1);
                  }
                }
                else {
                  puVar20 = (uint *)local_138;
                  pcVar27 = (cpp_dec_float<200U,_int,_void> *)local_4d8;
                  for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
                    (pcVar27->data)._M_elems[0] = *puVar20;
                    puVar20 = puVar20 + (ulong)bVar35 * -2 + 1;
                    pcVar27 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar27 + (ulong)bVar35 * -8 + 4);
                  }
                  iStack_468 = iStack_c8;
                  bStack_464 = bStack_c4;
                  local_460._0_4_ = (fpclass_type)local_c0;
                  local_460._4_4_ = local_c0._4_4_;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                            ((cpp_dec_float<200U,_int,_void> *)local_4d8,pcVar28);
                }
                pcVar28 = (cpp_dec_float<200U,_int,_void> *)local_4d8;
                puVar20 = (uint *)local_2e8;
                for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
                  *puVar20 = (pcVar28->data)._M_elems[0];
                  pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar28 + (ulong)bVar35 * -8 + 4);
                  puVar20 = puVar20 + (ulong)bVar35 * -2 + 1;
                }
                iStack_278 = iStack_468;
                bStack_274 = bStack_464;
                local_270._0_4_ = (fpclass_type)local_460;
                local_270._4_4_ = local_460._4_4_;
                if ((fpclass_type)local_460 != cpp_dec_float_NaN) {
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                  cpp_dec_float<long_long>
                            ((cpp_dec_float<200U,_int,_void> *)local_4d8,0,(type *)0x0);
                  iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                     ((cpp_dec_float<200U,_int,_void> *)local_2e8,
                                      (cpp_dec_float<200U,_int,_void> *)local_4d8);
                  if (-1 < iVar10) {
                    u = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)local_398;
                    pUVar21 = v;
                    pcVar28 = (cpp_dec_float<200U,_int,_void> *)u;
                    for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
                      (pcVar28->data)._M_elems[0] =
                           (((cpp_dec_float<200U,_int,_void> *)pUVar21)->data)._M_elems[0];
                      pUVar21 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)((long)pUVar21 + (ulong)bVar35 * -8 + 4);
                      pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar28 + (ulong)bVar35 * -8 + 4);
                    }
                    iStack_328 = (this->fastDelta).m_backend.exp;
                    bStack_324 = (this->fastDelta).m_backend.neg;
                    local_320._0_4_ = (this->fastDelta).m_backend.fpclass;
                    local_320._4_4_ = (this->fastDelta).m_backend.prec_elem;
                    if ((fpclass_type)local_320 != cpp_dec_float_finite || local_398._0_4_ != 0) {
                      bStack_324 = (bool)(bStack_324 ^ 1);
                    }
                    goto LAB_005c8cd5;
                  }
                }
                local_320._0_4_ = cpp_dec_float_finite;
                local_320._4_4_ = 0x1c;
                local_398._0_16_ = (undefined1  [16])0x0;
                local_398._16_16_ = (undefined1  [16])0x0;
                local_378 = (undefined1  [16])0x0;
                local_368 = (undefined1  [16])0x0;
                local_358 = (undefined1  [16])0x0;
                local_348 = (undefined1  [16])0x0;
                local_338 = SUB1613((undefined1  [16])0x0,0);
                uStack_32b = 0;
                iStack_328 = 0;
                bStack_324 = false;
                if ((UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)local_398 == v) {
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                            ((cpp_dec_float<200U,_int,_void> *)local_398,
                             (cpp_dec_float<200U,_int,_void> *)local_2e8);
                  if (local_398._0_4_ != 0 || (fpclass_type)local_320 != cpp_dec_float_finite) {
                    bStack_324 = (bool)(bStack_324 ^ 1);
                  }
                }
                else {
                  pcVar28 = (cpp_dec_float<200U,_int,_void> *)local_2e8;
                  pcVar27 = (cpp_dec_float<200U,_int,_void> *)local_398;
                  for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
                    (pcVar27->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
                    pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar28 + (ulong)bVar35 * -8 + 4);
                    pcVar27 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar27 + (ulong)bVar35 * -8 + 4);
                  }
                  iStack_328 = iStack_278;
                  bStack_324 = bStack_274;
                  local_320._0_4_ = (fpclass_type)local_270;
                  local_320._4_4_ = local_270._4_4_;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                            ((cpp_dec_float<200U,_int,_void> *)local_398,
                             (cpp_dec_float<200U,_int,_void> *)v);
                }
                local_460 = 0x1c00000000;
                local_4d8._0_16_ = (undefined1  [16])0x0;
                local_4d8._16_16_ = (undefined1  [16])0x0;
                local_4b8 = (undefined1  [16])0x0;
                local_4a8 = (undefined1  [16])0x0;
                local_498 = (undefined1  [16])0x0;
                local_488 = (undefined1  [16])0x0;
                local_478 = SUB1613((undefined1  [16])0x0,0);
                uStack_46b = 0;
                iStack_468 = 0;
                bStack_464 = false;
                boost::multiprecision::default_ops::
                eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                          ((cpp_dec_float<200U,_int,_void> *)local_4d8,
                           (cpp_dec_float<200U,_int,_void> *)local_398,
                           (cpp_dec_float<200U,_int,_void> *)local_438);
                pcVar28 = (cpp_dec_float<200U,_int,_void> *)local_4d8;
                pcVar27 = (cpp_dec_float<200U,_int,_void> *)local_438;
                for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
                  (pcVar27->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
                  pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar28 + (ulong)bVar35 * -8 + 4);
                  pcVar27 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar27 + (ulong)bVar35 * -8 + 4);
                }
                iStack_3c8 = iStack_468;
                abStack_3c4[0] = bStack_464;
                local_3c0 = local_460;
                u = local_3a8;
                goto LAB_005c8df9;
              }
            }
          }
        }
        else {
          iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             ((cpp_dec_float<200U,_int,_void> *)local_438,
                              (cpp_dec_float<200U,_int,_void> *)local_4d8);
          if (iVar11 < 1) goto LAB_005c8493;
          bVar34 = false;
          if (((fpclass_type)local_3c0 != cpp_dec_float_NaN) &&
             (local_268.fpclass != cpp_dec_float_NaN)) {
            iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)local_438,&local_268);
            bVar34 = 0 < iVar11;
          }
          pcVar28 = &local_268;
          if (bVar34) {
            pcVar28 = (cpp_dec_float<200U,_int,_void> *)local_438;
          }
          piVar15 = &local_268.exp;
          if (bVar34) {
            piVar15 = &iStack_3c8;
          }
          pcVar27 = &local_268;
          for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
            (pcVar27->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
            pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar28 + ((ulong)bVar35 * -2 + 1) * 4);
            pcVar27 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar27 + ((ulong)bVar35 * -2 + 1) * 4);
          }
          local_268.exp = *piVar15;
          pbVar13 = &local_268.neg;
          if (bVar34) {
            pbVar13 = abStack_3c4;
          }
          local_268.neg = *pbVar13;
          uVar36 = CONCAT44((int)((uint)bVar34 << 0x1f) >> 0x1f,(int)((uint)bVar34 << 0x1f) >> 0x1f)
          ;
          local_268._120_8_ = ~uVar36 & local_268._120_8_ | local_3c0 & uVar36;
          pnVar19 = (pointer)((long)local_310 + (long)iVar10 * 0x80);
          puVar24 = (undefined4 *)local_b8;
          for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
            *puVar24 = (pnVar19->m_backend).data._M_elems[0];
            pnVar19 = (pointer)((long)pnVar19 + ((ulong)bVar35 * -2 + 1) * 4);
            puVar24 = puVar24 + (ulong)bVar35 * -2 + 1;
          }
          iStack_48 = (((pointer)((long)local_310 + (long)iVar10 * 0x80))->m_backend).exp;
          bStack_44 = (((pointer)((long)local_310 + (long)iVar10 * 0x80))->m_backend).neg;
          local_40._0_4_ = (((pointer)((long)local_310 + (long)iVar10 * 0x80))->m_backend).fpclass;
          local_40._4_4_ = (((pointer)((long)local_310 + (long)iVar10 * 0x80))->m_backend).prec_elem
          ;
          ::soplex::infinity::__tls_init();
          local_460 = 0x1c00000000;
          local_4d8._0_16_ = (undefined1  [16])0x0;
          local_4d8._16_16_ = (undefined1  [16])0x0;
          local_4b8 = (undefined1  [16])0x0;
          local_4a8 = (undefined1  [16])0x0;
          local_498 = (undefined1  [16])0x0;
          local_488 = (undefined1  [16])0x0;
          local_478 = SUB1613((undefined1  [16])0x0,0);
          uStack_46b = 0;
          iStack_468 = 0;
          bStack_464 = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)local_4d8,local_158);
          if (((fpclass_type)local_40 != cpp_dec_float_NaN) &&
             ((fpclass_type)local_460 != cpp_dec_float_NaN)) {
            iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)local_b8,
                                (cpp_dec_float<200U,_int,_void> *)local_4d8);
            if (-1 < iVar11) goto LAB_005c87e8;
            pcVar28 = &local_3b0[iVar10].m_backend;
            local_460._0_4_ = cpp_dec_float_finite;
            local_460._4_4_ = 0x1c;
            local_4d8._0_16_ = (undefined1  [16])0x0;
            local_4d8._16_16_ = (undefined1  [16])0x0;
            local_4b8 = (undefined1  [16])0x0;
            local_4a8 = (undefined1  [16])0x0;
            local_498 = (undefined1  [16])0x0;
            local_488 = (undefined1  [16])0x0;
            local_478 = SUB1613((undefined1  [16])0x0,0);
            uStack_46b = 0;
            iStack_468 = 0;
            bStack_464 = false;
            if ((cpp_dec_float<200U,_int,_void> *)local_4d8 == pcVar28) {
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        ((cpp_dec_float<200U,_int,_void> *)local_4d8,
                         (cpp_dec_float<200U,_int,_void> *)local_b8);
              if (local_4d8._0_4_ != 0 || (fpclass_type)local_460 != cpp_dec_float_finite) {
                bStack_464 = (bool)(bStack_464 ^ 1);
              }
            }
            else {
              puVar20 = (uint *)local_b8;
              pcVar27 = (cpp_dec_float<200U,_int,_void> *)local_4d8;
              for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
                (pcVar27->data)._M_elems[0] = *puVar20;
                puVar20 = puVar20 + (ulong)bVar35 * -2 + 1;
                pcVar27 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar27 + (ulong)bVar35 * -8 + 4)
                ;
              }
              iStack_468 = iStack_48;
              bStack_464 = bStack_44;
              local_460._0_4_ = (fpclass_type)local_40;
              local_460._4_4_ = local_40._4_4_;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        ((cpp_dec_float<200U,_int,_void> *)local_4d8,pcVar28);
            }
            pcVar28 = (cpp_dec_float<200U,_int,_void> *)local_4d8;
            puVar20 = (uint *)local_2e8;
            for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
              *puVar20 = (pcVar28->data)._M_elems[0];
              pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4);
              puVar20 = puVar20 + (ulong)bVar35 * -2 + 1;
            }
            iStack_278 = iStack_468;
            bStack_274 = bStack_464;
            local_270._0_4_ = (fpclass_type)local_460;
            local_270._4_4_ = local_460._4_4_;
            if ((fpclass_type)local_460 == cpp_dec_float_NaN) {
LAB_005c8948:
              local_320._0_4_ = cpp_dec_float_finite;
              local_320._4_4_ = 0x1c;
              local_398._0_16_ = (undefined1  [16])0x0;
              local_398._16_16_ = (undefined1  [16])0x0;
              local_378 = (undefined1  [16])0x0;
              local_368 = (undefined1  [16])0x0;
              local_358 = (undefined1  [16])0x0;
              local_348 = (undefined1  [16])0x0;
              local_338 = SUB1613((undefined1  [16])0x0,0);
              uStack_32b = 0;
              iStack_328 = 0;
              bStack_324 = false;
              pcVar28 = (cpp_dec_float<200U,_int,_void> *)local_2e8;
              if ((UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)local_398 != u) {
                pcVar27 = (cpp_dec_float<200U,_int,_void> *)local_398;
                for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
                  (pcVar27->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
                  pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar28 + (ulong)bVar35 * -8 + 4);
                  pcVar27 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar27 + (ulong)bVar35 * -8 + 4);
                }
                iStack_328 = iStack_278;
                bStack_324 = bStack_274;
                local_320._0_4_ = (fpclass_type)local_270;
                local_320._4_4_ = local_270._4_4_;
                pcVar28 = (cpp_dec_float<200U,_int,_void> *)u;
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                        ((cpp_dec_float<200U,_int,_void> *)local_398,pcVar28);
              local_460 = 0x1c00000000;
              local_4d8._0_16_ = (undefined1  [16])0x0;
              local_4d8._16_16_ = (undefined1  [16])0x0;
              local_4b8 = (undefined1  [16])0x0;
              local_4a8 = (undefined1  [16])0x0;
              local_498 = (undefined1  [16])0x0;
              local_488 = (undefined1  [16])0x0;
              local_478 = SUB1613((undefined1  [16])0x0,0);
              uStack_46b = 0;
              iStack_468 = 0;
              bStack_464 = false;
              pcVar28 = (cpp_dec_float<200U,_int,_void> *)local_4d8;
              pcVar27 = (cpp_dec_float<200U,_int,_void> *)local_438;
              boost::multiprecision::default_ops::
              eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                        (pcVar28,(cpp_dec_float<200U,_int,_void> *)local_398,pcVar27);
              lVar12 = 0x1c;
            }
            else {
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>((cpp_dec_float<200U,_int,_void> *)local_4d8,0,(type *)0x0);
              iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)local_2e8,
                                  (cpp_dec_float<200U,_int,_void> *)local_4d8);
              v = u;
              if (0 < iVar10) goto LAB_005c8948;
LAB_005c8cd5:
              local_460 = 0x1c00000000;
              bStack_464 = false;
              iStack_468 = 0;
              uStack_46b = 0;
              local_478 = SUB1613((undefined1  [16])0x0,0);
              local_488 = (undefined1  [16])0x0;
              local_498 = (undefined1  [16])0x0;
              local_4a8 = (undefined1  [16])0x0;
              local_4b8 = (undefined1  [16])0x0;
              local_4d8._16_16_ = (undefined1  [16])0x0;
              local_4d8._0_16_ = (undefined1  [16])0x0;
              boost::multiprecision::default_ops::
              eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                        ((cpp_dec_float<200U,_int,_void> *)local_4d8,
                         (cpp_dec_float<200U,_int,_void> *)u,
                         (cpp_dec_float<200U,_int,_void> *)local_438);
              lVar12 = 0x1c;
              pcVar28 = (cpp_dec_float<200U,_int,_void> *)local_4d8;
              pcVar27 = (cpp_dec_float<200U,_int,_void> *)local_438;
              u = v;
            }
            for (; lVar12 != 0; lVar12 = lVar12 + -1) {
              (pcVar27->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
              pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4);
              pcVar27 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar27 + (ulong)bVar35 * -8 + 4);
            }
            iStack_3c8 = iStack_468;
            abStack_3c4[0] = bStack_464;
            local_3c0 = local_460;
LAB_005c8df9:
            local_3c0._0_4_ = (fpclass_type)local_460;
            bVar34 = (fpclass_type)local_3c0 != cpp_dec_float_NaN;
            iStack_3c8 = iStack_468;
            abStack_3c4[0] = bStack_464;
            local_3c0 = local_460;
            if ((bVar34) && ((fpclass_type)local_160 != cpp_dec_float_NaN)) {
              iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)local_438,
                                  (cpp_dec_float<200U,_int,_void> *)local_1d8);
              if (iVar10 < 0) {
                puVar24 = (undefined4 *)local_438;
                puVar25 = (undefined4 *)local_1d8;
                for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
                  *puVar25 = *puVar24;
                  puVar24 = puVar24 + (ulong)bVar35 * -2 + 1;
                  puVar25 = puVar25 + (ulong)bVar35 * -2 + 1;
                }
                iStack_168 = iStack_3c8;
                bStack_164 = abStack_3c4[0];
                local_160 = local_3c0;
                local_44c = local_1e8._0_4_;
              }
            }
          }
        }
LAB_005c87e8:
        piVar16 = (int *)((long)piVar16 + (long)local_308);
      } while (piVar16 < local_440);
    }
  }
  else {
    (update->thedelta).setupStatus = false;
    local_3a8 = update;
    lVar12 = (long)(int)((ulong)((long)(update->
                                       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       ).val.
                                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)local_3b0)
                        >> 7);
    if (lVar12 < 1) {
      local_44c = -1;
    }
    else {
      local_308 = pnVar6 + lVar12;
      local_440 = &this->epsilon;
      local_2f8 = &(this->fastDelta).m_backend;
      local_1e8 = *(double *)(in_FS_OFFSET + -8);
      uStack_1e0 = 0;
      local_158 = -*(double *)(in_FS_OFFSET + -8);
      uStack_150 = 0x8000000000000000;
      local_310 = &(((pointer)local_310)->m_backend).fpclass;
      local_318 = &(((pointer)local_318)->m_backend).fpclass;
      local_44c = -1;
      lVar33 = 0;
      lVar17 = 0;
      lVar12 = 0;
      piVar16 = (int *)pnVar18;
      do {
        this_00 = (cpp_dec_float<200u,int,void> *)((long)&(pnVar6->m_backend).data + lVar17);
        pcVar22 = this_00;
        puVar24 = (undefined4 *)local_438;
        for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
          *puVar24 = *(undefined4 *)pcVar22;
          pcVar22 = pcVar22 + (ulong)bVar35 * -8 + 4;
          puVar24 = puVar24 + (ulong)bVar35 * -2 + 1;
        }
        iStack_3c8 = *(int *)((long)&(pnVar6->m_backend).data + lVar17 + 0x70);
        abStack_3c4[0] = (bool)*(byte *)((long)&(pnVar6->m_backend).data + lVar17 + 0x74);
        local_3c0 = *(ulong *)((long)&(pnVar6->m_backend).data + lVar17 + 0x78);
        pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)piVar16;
        if ((int)local_3c0 != 2) {
          local_460._0_4_ = cpp_dec_float_finite;
          local_460._4_4_ = 0x1c;
          local_4d8._0_16_ = (undefined1  [16])0x0;
          local_4d8._16_16_ = (undefined1  [16])0x0;
          local_4b8 = (undefined1  [16])0x0;
          local_4a8 = (undefined1  [16])0x0;
          local_498 = (undefined1  [16])0x0;
          local_488 = (undefined1  [16])0x0;
          local_478 = SUB1613((undefined1  [16])0x0,0);
          uStack_46b = 0;
          iStack_468 = 0;
          bStack_464 = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)local_4d8,0.0);
          iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             ((cpp_dec_float<200U,_int,_void> *)local_438,
                              (cpp_dec_float<200U,_int,_void> *)local_4d8);
          if (iVar10 != 0) goto LAB_005c8ff3;
          goto LAB_005c9a70;
        }
LAB_005c8ff3:
        pnVar23 = local_440;
        pcVar28 = (cpp_dec_float<200U,_int,_void> *)local_4d8;
        for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
          (pcVar28->data)._M_elems[0] = (pnVar23->m_backend).data._M_elems[0];
          pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar23 + (ulong)bVar35 * -8 + 4);
          pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4);
        }
        bStack_464 = (this->epsilon).m_backend.neg;
        iStack_468 = (this->epsilon).m_backend.exp;
        fVar3 = (this->epsilon).m_backend.fpclass;
        iVar8 = (this->epsilon).m_backend.prec_elem;
        local_460._0_4_ = fVar3;
        local_460._4_4_ = iVar8;
        if (local_4d8._0_4_ != 0 || fVar3 != cpp_dec_float_finite) {
          bStack_464 = (bool)(bStack_464 ^ 1);
        }
        if (((fVar3 != cpp_dec_float_NaN) && ((fpclass_type)local_3c0 != cpp_dec_float_NaN)) &&
           (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)local_438,
                                (cpp_dec_float<200U,_int,_void> *)local_4d8), -1 < iVar10)) {
          pnVar23 = local_440;
          pcVar28 = (cpp_dec_float<200U,_int,_void> *)local_398;
          for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
            (pcVar28->data)._M_elems[0] = (pnVar23->m_backend).data._M_elems[0];
            pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar23 + (ulong)bVar35 * -8 + 4);
            pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4);
          }
          iStack_328 = (this->epsilon).m_backend.exp;
          bStack_324 = (this->epsilon).m_backend.neg;
          fVar1 = (this->epsilon).m_backend.fpclass;
          iVar2 = (this->epsilon).m_backend.prec_elem;
          local_320._0_4_ = fVar1;
          local_320._4_4_ = iVar2;
          if ((fVar1 != cpp_dec_float_NaN && (fpclass_type)local_3c0 != cpp_dec_float_NaN) &&
             (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)local_438,
                                  (cpp_dec_float<200U,_int,_void> *)local_398), iVar10 < 1)) {
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=(this_00,0.0);
            goto LAB_005c9a70;
          }
        }
        pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)(piVar16 + 1);
        iVar10 = (int)lVar12;
        *piVar16 = iVar10;
        if (local_39c == LEAVE) {
          if (this->iscoid == true) {
            pSVar5 = (this->
                     super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).thesolver;
            iVar11 = pSVar5->theRep *
                     ((pSVar5->
                      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedesc.costat)->data[lVar12];
          }
          else {
            pSVar5 = (this->
                     super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).thesolver;
            iVar11 = pSVar5->theRep *
                     ((pSVar5->
                      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedesc.stat)->data[lVar12];
          }
          if (0 < iVar11) goto LAB_005c9a70;
        }
        if ((char)local_300 != '\0') {
          pSVar5 = (this->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver;
          pSVar7 = (pSVar5->
                   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).theBaseId.data;
          if (0 < *(int *)((long)&(pSVar7->super_DataKey).info + lVar33)) {
            SPxColId::SPxColId((SPxColId *)local_4d8,
                               (SPxId *)((long)&(pSVar7->super_DataKey).info + lVar33));
            iVar11 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                     ::number(&(pSVar5->
                               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).
                               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .
                               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .set,(DataKey *)local_4d8);
            if ((pSVar5->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.colstat.data[iVar11] == P_FIXED) goto LAB_005c9a70;
          }
        }
        pnVar23 = local_440;
        pcVar28 = (cpp_dec_float<200U,_int,_void> *)local_4d8;
        for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
          (pcVar28->data)._M_elems[0] = (pnVar23->m_backend).data._M_elems[0];
          pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar23 + (ulong)bVar35 * -8 + 4);
          pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4);
        }
        iStack_468 = (this->epsilon).m_backend.exp;
        bStack_464 = (this->epsilon).m_backend.neg;
        local_460._0_4_ = (this->epsilon).m_backend.fpclass;
        local_460._4_4_ = (this->epsilon).m_backend.prec_elem;
        if (((fpclass_type)local_460 == cpp_dec_float_NaN ||
             (fpclass_type)local_3c0 == cpp_dec_float_NaN) ||
           (iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)local_438,
                                (cpp_dec_float<200U,_int,_void> *)local_4d8), iVar11 < 1)) {
          pnVar23 = local_440;
          pcVar28 = (cpp_dec_float<200U,_int,_void> *)local_4d8;
          for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
            (pcVar28->data)._M_elems[0] = (pnVar23->m_backend).data._M_elems[0];
            pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar23 + (ulong)bVar35 * -8 + 4);
            pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4);
          }
          bStack_464 = (this->epsilon).m_backend.neg;
          iStack_468 = (this->epsilon).m_backend.exp;
          fVar4 = (this->epsilon).m_backend.fpclass;
          iVar9 = (this->epsilon).m_backend.prec_elem;
          local_460._0_4_ = fVar4;
          local_460._4_4_ = iVar9;
          if (local_4d8._0_4_ != 0 || fVar4 != cpp_dec_float_finite) {
            bStack_464 = (bool)(bStack_464 ^ 1);
          }
          if (((fVar4 != cpp_dec_float_NaN) && ((fpclass_type)local_3c0 != cpp_dec_float_NaN)) &&
             (local_448 = pnVar18,
             iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                ((cpp_dec_float<200U,_int,_void> *)local_438,
                                 (cpp_dec_float<200U,_int,_void> *)local_4d8), pnVar18 = local_448,
             iVar11 < 0)) {
            pcVar28 = (cpp_dec_float<200U,_int,_void> *)local_438;
            pcVar27 = (cpp_dec_float<200U,_int,_void> *)local_4d8;
            for (lVar14 = 0x1c; pnVar18 = local_448, lVar14 != 0; lVar14 = lVar14 + -1) {
              (pcVar27->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
              pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4);
              pcVar27 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar27 + (ulong)bVar35 * -8 + 4);
            }
            iStack_468 = iStack_3c8;
            bStack_464 = abStack_3c4[0];
            local_460 = local_3c0;
            if (local_4d8._0_4_ != 0 || (int)local_3c0 != 0) {
              bStack_464 = (bool)(abStack_3c4[0] ^ 1);
            }
            puVar26 = local_268.data._M_elems + 1;
            if ((((int)local_3c0 == 2) || (local_268.fpclass == cpp_dec_float_NaN)) ||
               (iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   ((cpp_dec_float<200U,_int,_void> *)local_4d8,&local_268),
               iVar11 < 1)) {
              puVar20 = puVar26;
              puVar29 = (uint *)local_398;
              for (lVar14 = 0x1b; iVar11 = local_268.exp, bVar32 = local_268.neg,
                  uVar36 = local_268._120_8_, lVar14 != 0; lVar14 = lVar14 + -1) {
                *puVar29 = *puVar20;
                puVar20 = puVar20 + (ulong)bVar35 * -2 + 1;
                puVar29 = puVar29 + (ulong)bVar35 * -2 + 1;
              }
            }
            else {
              puVar24 = (undefined4 *)(local_438 + 4);
              puVar25 = (undefined4 *)local_398;
              for (lVar14 = 0x1b; lVar14 != 0; lVar14 = lVar14 + -1) {
                *puVar25 = *puVar24;
                puVar24 = puVar24 + (ulong)bVar35 * -2 + 1;
                puVar25 = puVar25 + (ulong)bVar35 * -2 + 1;
              }
              local_268.data._M_elems[0] = local_438._0_4_;
              iVar11 = iStack_3c8;
              bVar32 = ((int)local_3c0 != 0 || local_438._0_4_ != 0) ^ abStack_3c4[0];
              uVar36 = local_3c0;
            }
            puVar20 = (uint *)local_398;
            for (lVar14 = 0x1b; lVar14 != 0; lVar14 = lVar14 + -1) {
              *puVar26 = *puVar20;
              puVar20 = puVar20 + (ulong)bVar35 * -2 + 1;
              puVar26 = puVar26 + (ulong)bVar35 * -2 + 1;
            }
            puVar24 = (undefined4 *)((long)local_318 + lVar17 + -0x78);
            puVar25 = puVar24;
            puVar30 = (undefined4 *)local_138;
            for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
              *puVar30 = *puVar25;
              puVar25 = puVar25 + (ulong)bVar35 * -2 + 1;
              puVar30 = puVar30 + (ulong)bVar35 * -2 + 1;
            }
            iStack_c8 = puVar24[0x1c];
            bStack_c4 = *(bool *)(puVar24 + 0x1d);
            local_c0 = *(undefined8 *)(puVar24 + 0x1e);
            local_268.exp = iVar11;
            local_268.neg = (bool)bVar32;
            local_268._120_8_ = uVar36;
            ::soplex::infinity::__tls_init();
            local_460._0_4_ = cpp_dec_float_finite;
            local_460._4_4_ = 0x1c;
            local_4d8._0_16_ = (undefined1  [16])0x0;
            local_4d8._16_16_ = (undefined1  [16])0x0;
            local_4b8 = (undefined1  [16])0x0;
            local_4a8 = (undefined1  [16])0x0;
            local_498 = (undefined1  [16])0x0;
            local_488 = (undefined1  [16])0x0;
            local_478 = SUB1613((undefined1  [16])0x0,0);
            uStack_46b = 0;
            iStack_468 = 0;
            bStack_464 = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)local_4d8,local_158);
            if (((fpclass_type)local_c0 != cpp_dec_float_NaN) &&
               ((fpclass_type)local_460 != cpp_dec_float_NaN)) {
              iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)local_138,
                                  (cpp_dec_float<200U,_int,_void> *)local_4d8);
              if (0 < iVar11) {
                pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)&local_3b0->m_backend + lVar17);
                local_460._0_4_ = cpp_dec_float_finite;
                local_460._4_4_ = 0x1c;
                local_4d8._0_16_ = (undefined1  [16])0x0;
                local_4d8._16_16_ = (undefined1  [16])0x0;
                local_4b8 = (undefined1  [16])0x0;
                local_4a8 = (undefined1  [16])0x0;
                local_498 = (undefined1  [16])0x0;
                local_488 = (undefined1  [16])0x0;
                local_478 = SUB1613((undefined1  [16])0x0,0);
                uStack_46b = 0;
                iStack_468 = 0;
                bStack_464 = false;
                if (pcVar28 == (cpp_dec_float<200U,_int,_void> *)local_4d8) {
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                            ((cpp_dec_float<200U,_int,_void> *)local_4d8,
                             (cpp_dec_float<200U,_int,_void> *)local_138);
                  if (local_4d8._0_4_ != 0 || (fpclass_type)local_460 != cpp_dec_float_finite) {
                    bStack_464 = (bool)(bStack_464 ^ 1);
                  }
                }
                else {
                  puVar26 = (uint *)local_138;
                  pcVar27 = (cpp_dec_float<200U,_int,_void> *)local_4d8;
                  for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                    (pcVar27->data)._M_elems[0] = *puVar26;
                    puVar26 = puVar26 + (ulong)bVar35 * -2 + 1;
                    pcVar27 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar27 + (ulong)bVar35 * -8 + 4);
                  }
                  iStack_468 = iStack_c8;
                  bStack_464 = bStack_c4;
                  local_460._0_4_ = (fpclass_type)local_c0;
                  local_460._4_4_ = local_c0._4_4_;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                            ((cpp_dec_float<200U,_int,_void> *)local_4d8,pcVar28);
                }
                pcVar28 = local_2f8;
                pcVar27 = (cpp_dec_float<200U,_int,_void> *)local_4d8;
                puVar26 = (uint *)local_2e8;
                for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                  *puVar26 = (pcVar27->data)._M_elems[0];
                  pcVar27 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar27 + (ulong)bVar35 * -8 + 4);
                  puVar26 = puVar26 + (ulong)bVar35 * -2 + 1;
                }
                iStack_278 = iStack_468;
                bStack_274 = bStack_464;
                local_270._0_4_ = (fpclass_type)local_460;
                local_270._4_4_ = local_460._4_4_;
                if ((fpclass_type)local_460 == cpp_dec_float_NaN) {
LAB_005c9c3f:
                  local_320._0_4_ = cpp_dec_float_finite;
                  local_320._4_4_ = 0x1c;
                  local_398._0_16_ = (undefined1  [16])0x0;
                  local_398._16_16_ = (undefined1  [16])0x0;
                  local_378 = (undefined1  [16])0x0;
                  local_368 = (undefined1  [16])0x0;
                  local_358 = (undefined1  [16])0x0;
                  local_348 = (undefined1  [16])0x0;
                  local_338 = SUB1613((undefined1  [16])0x0,0);
                  uStack_32b = 0;
                  iStack_328 = 0;
                  bStack_324 = false;
                  if ((cpp_dec_float<200U,_int,_void> *)local_398 == pcVar28) {
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                              ((cpp_dec_float<200U,_int,_void> *)local_398,
                               (cpp_dec_float<200U,_int,_void> *)local_2e8);
                    if (local_398._0_4_ != 0 || (fpclass_type)local_320 != cpp_dec_float_finite) {
                      bStack_324 = (bool)(bStack_324 ^ 1);
                    }
                  }
                  else {
                    pcVar27 = (cpp_dec_float<200U,_int,_void> *)local_2e8;
                    pcVar31 = (cpp_dec_float<200U,_int,_void> *)local_398;
                    for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                      (pcVar31->data)._M_elems[0] = (pcVar27->data)._M_elems[0];
                      pcVar27 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar27 + (ulong)bVar35 * -8 + 4);
                      pcVar31 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar31 + (ulong)bVar35 * -8 + 4);
                    }
                    iStack_328 = iStack_278;
                    bStack_324 = bStack_274;
                    local_320._0_4_ = (fpclass_type)local_270;
                    local_320._4_4_ = local_270._4_4_;
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                              ((cpp_dec_float<200U,_int,_void> *)local_398,pcVar28);
                  }
                  local_460 = 0x1c00000000;
                  local_4d8._0_16_ = (undefined1  [16])0x0;
                  local_4d8._16_16_ = (undefined1  [16])0x0;
                  local_4b8 = (undefined1  [16])0x0;
                  local_4a8 = (undefined1  [16])0x0;
                  local_498 = (undefined1  [16])0x0;
                  local_488 = (undefined1  [16])0x0;
                  local_478 = SUB1613((undefined1  [16])0x0,0);
                  uStack_46b = 0;
                  iStack_468 = 0;
                  bStack_464 = false;
                  boost::multiprecision::default_ops::
                  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                            ((cpp_dec_float<200U,_int,_void> *)local_4d8,
                             (cpp_dec_float<200U,_int,_void> *)local_398,
                             (cpp_dec_float<200U,_int,_void> *)local_438);
                  pcVar28 = (cpp_dec_float<200U,_int,_void> *)local_4d8;
                  pcVar27 = (cpp_dec_float<200U,_int,_void> *)local_438;
                  for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                    (pcVar27->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
                    pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar28 + (ulong)bVar35 * -8 + 4);
                    pcVar27 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar27 + (ulong)bVar35 * -8 + 4);
                  }
                  iStack_3c8 = iStack_468;
                  abStack_3c4[0] = bStack_464;
                  local_3c0 = local_460;
                  pnVar18 = local_448;
                }
                else {
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                  cpp_dec_float<long_long>
                            ((cpp_dec_float<200U,_int,_void> *)local_4d8,0,(type *)0x0);
                  iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                     ((cpp_dec_float<200U,_int,_void> *)local_2e8,
                                      (cpp_dec_float<200U,_int,_void> *)local_4d8);
                  if (iVar11 < 0) goto LAB_005c9c3f;
                  pcVar27 = (cpp_dec_float<200U,_int,_void> *)local_398;
                  for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                    (pcVar27->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
                    pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar28 + (ulong)bVar35 * -8 + 4);
                    pcVar27 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar27 + (ulong)bVar35 * -8 + 4);
                  }
                  iStack_328 = (this->fastDelta).m_backend.exp;
                  bStack_324 = (this->fastDelta).m_backend.neg;
                  local_320._0_4_ = (this->fastDelta).m_backend.fpclass;
                  local_320._4_4_ = (this->fastDelta).m_backend.prec_elem;
                  if ((fpclass_type)local_320 != cpp_dec_float_finite || local_398._0_4_ != 0) {
                    bStack_324 = (bool)(bStack_324 ^ 1);
                  }
                  local_460 = 0x1c00000000;
                  local_4d8._0_16_ = (undefined1  [16])0x0;
                  local_4d8._16_16_ = (undefined1  [16])0x0;
                  local_4b8 = (undefined1  [16])0x0;
                  local_4a8 = (undefined1  [16])0x0;
                  local_498 = (undefined1  [16])0x0;
                  local_488 = (undefined1  [16])0x0;
                  local_478 = SUB1613((undefined1  [16])0x0,0);
                  uStack_46b = 0;
                  iStack_468 = 0;
                  bStack_464 = false;
                  boost::multiprecision::default_ops::
                  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                            ((cpp_dec_float<200U,_int,_void> *)local_4d8,
                             (cpp_dec_float<200U,_int,_void> *)local_398,
                             (cpp_dec_float<200U,_int,_void> *)local_438);
                  puVar26 = (uint *)local_4d8;
                  pcVar28 = (cpp_dec_float<200U,_int,_void> *)local_438;
                  for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                    (pcVar28->data)._M_elems[0] = *puVar26;
                    puVar26 = puVar26 + (ulong)bVar35 * -2 + 1;
                    pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar28 + (ulong)bVar35 * -8 + 4);
                  }
                  iStack_3c8 = iStack_468;
                  abStack_3c4[0] = bStack_464;
                  local_3c0 = local_460;
                }
                local_3c0._0_4_ = (fpclass_type)local_460;
                if ((((fpclass_type)local_3c0 != cpp_dec_float_NaN) &&
                    ((fpclass_type)local_160 != cpp_dec_float_NaN)) &&
                   (iStack_3c8 = iStack_468, abStack_3c4[0] = bStack_464, local_3c0 = local_460,
                   iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                      ((cpp_dec_float<200U,_int,_void> *)local_438,
                                       (cpp_dec_float<200U,_int,_void> *)local_1d8),
                   pnVar18 = local_448, iVar11 < 0)) {
                  pcVar28 = (cpp_dec_float<200U,_int,_void> *)local_438;
                  pcVar27 = (cpp_dec_float<200U,_int,_void> *)local_1d8;
                  for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                    (pcVar27->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
                    pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar28 + (ulong)bVar35 * -8 + 4);
                    pcVar27 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar27 + (ulong)bVar35 * -8 + 4);
                  }
                  iStack_168 = iStack_3c8;
                  bStack_164 = abStack_3c4[0];
                  local_160 = local_3c0;
                  local_44c = iVar10;
                }
              }
            }
          }
        }
        else {
          bVar34 = false;
          if (((fpclass_type)local_3c0 != cpp_dec_float_NaN) &&
             (local_268.fpclass != cpp_dec_float_NaN)) {
            iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)local_438,&local_268);
            bVar34 = 0 < iVar11;
          }
          pcVar28 = &local_268;
          if (bVar34) {
            pcVar28 = (cpp_dec_float<200U,_int,_void> *)local_438;
          }
          piVar16 = &local_268.exp;
          if (bVar34) {
            piVar16 = &iStack_3c8;
          }
          pbVar13 = &local_268.neg;
          if (bVar34) {
            pbVar13 = abStack_3c4;
          }
          pcVar27 = &local_268;
          for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
            (pcVar27->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
            pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4);
            pcVar27 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar27 + (ulong)bVar35 * -8 + 4);
          }
          local_268.exp = *piVar16;
          local_268.neg = *pbVar13;
          uVar36 = CONCAT44((int)((uint)bVar34 << 0x1f) >> 0x1f,(int)((uint)bVar34 << 0x1f) >> 0x1f)
          ;
          local_268._120_8_ = ~uVar36 & local_268._120_8_ | local_3c0 & uVar36;
          puVar24 = (undefined4 *)((long)local_310 + lVar17 + -0x78);
          puVar25 = puVar24;
          puVar30 = (undefined4 *)local_b8;
          for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
            *puVar30 = *puVar25;
            puVar25 = puVar25 + (ulong)bVar35 * -2 + 1;
            puVar30 = puVar30 + (ulong)bVar35 * -2 + 1;
          }
          iStack_48 = puVar24[0x1c];
          bStack_44 = *(bool *)(puVar24 + 0x1d);
          local_40 = *(undefined8 *)(puVar24 + 0x1e);
          ::soplex::infinity::__tls_init();
          local_460._0_4_ = cpp_dec_float_finite;
          local_460._4_4_ = 0x1c;
          local_4d8._0_16_ = (undefined1  [16])0x0;
          local_4d8._16_16_ = (undefined1  [16])0x0;
          local_4b8 = (undefined1  [16])0x0;
          local_4a8 = (undefined1  [16])0x0;
          local_498 = (undefined1  [16])0x0;
          local_488 = (undefined1  [16])0x0;
          local_478 = SUB1613((undefined1  [16])0x0,0);
          uStack_46b = 0;
          iStack_468 = 0;
          bStack_464 = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)local_4d8,local_1e8);
          if (((fpclass_type)local_40 != cpp_dec_float_NaN) &&
             ((fpclass_type)local_460 != cpp_dec_float_NaN)) {
            iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)local_b8,
                                (cpp_dec_float<200U,_int,_void> *)local_4d8);
            if (iVar11 < 0) {
              pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)&local_3b0->m_backend + lVar17);
              local_460._0_4_ = cpp_dec_float_finite;
              local_460._4_4_ = 0x1c;
              local_4d8._0_16_ = (undefined1  [16])0x0;
              local_4d8._16_16_ = (undefined1  [16])0x0;
              local_4b8 = (undefined1  [16])0x0;
              local_4a8 = (undefined1  [16])0x0;
              local_498 = (undefined1  [16])0x0;
              local_488 = (undefined1  [16])0x0;
              local_478 = SUB1613((undefined1  [16])0x0,0);
              uStack_46b = 0;
              iStack_468 = 0;
              bStack_464 = false;
              if (pcVar28 == (cpp_dec_float<200U,_int,_void> *)local_4d8) {
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          ((cpp_dec_float<200U,_int,_void> *)local_4d8,
                           (cpp_dec_float<200U,_int,_void> *)local_b8);
                if (local_4d8._0_4_ != 0 || (fpclass_type)local_460 != cpp_dec_float_finite) {
                  bStack_464 = (bool)(bStack_464 ^ 1);
                }
              }
              else {
                puVar26 = (uint *)local_b8;
                pcVar27 = (cpp_dec_float<200U,_int,_void> *)local_4d8;
                for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                  (pcVar27->data)._M_elems[0] = *puVar26;
                  puVar26 = puVar26 + (ulong)bVar35 * -2 + 1;
                  pcVar27 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar27 + (ulong)bVar35 * -8 + 4);
                }
                iStack_468 = iStack_48;
                bStack_464 = bStack_44;
                local_460._0_4_ = (fpclass_type)local_40;
                local_460._4_4_ = local_40._4_4_;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          ((cpp_dec_float<200U,_int,_void> *)local_4d8,pcVar28);
              }
              pcVar28 = (cpp_dec_float<200U,_int,_void> *)local_4d8;
              puVar26 = (uint *)local_2e8;
              for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                *puVar26 = (pcVar28->data)._M_elems[0];
                pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4)
                ;
                puVar26 = puVar26 + (ulong)bVar35 * -2 + 1;
              }
              iStack_278 = iStack_468;
              bStack_274 = bStack_464;
              local_270._0_4_ = (fpclass_type)local_460;
              local_270._4_4_ = local_460._4_4_;
              if ((fpclass_type)local_460 == cpp_dec_float_NaN) {
LAB_005c988c:
                pcVar28 = local_2f8;
                local_448 = pnVar18;
                local_320._0_4_ = cpp_dec_float_finite;
                local_320._4_4_ = 0x1c;
                local_398._0_16_ = (undefined1  [16])0x0;
                local_398._16_16_ = (undefined1  [16])0x0;
                local_378 = (undefined1  [16])0x0;
                local_368 = (undefined1  [16])0x0;
                local_358 = (undefined1  [16])0x0;
                local_348 = (undefined1  [16])0x0;
                local_338 = SUB1613((undefined1  [16])0x0,0);
                uStack_32b = 0;
                iStack_328 = 0;
                bStack_324 = false;
                pcVar27 = (cpp_dec_float<200U,_int,_void> *)local_2e8;
                if ((cpp_dec_float<200U,_int,_void> *)local_398 != local_2f8) {
                  pcVar31 = (cpp_dec_float<200U,_int,_void> *)local_398;
                  for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                    (pcVar31->data)._M_elems[0] = (pcVar27->data)._M_elems[0];
                    pcVar27 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar27 + (ulong)bVar35 * -8 + 4);
                    pcVar31 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar31 + (ulong)bVar35 * -8 + 4);
                  }
                  iStack_328 = iStack_278;
                  bStack_324 = bStack_274;
                  local_320._0_4_ = (fpclass_type)local_270;
                  local_320._4_4_ = local_270._4_4_;
                  pcVar27 = pcVar28;
                }
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                          ((cpp_dec_float<200U,_int,_void> *)local_398,pcVar27);
                local_460 = 0x1c00000000;
                local_4d8._0_16_ = (undefined1  [16])0x0;
                local_4d8._16_16_ = (undefined1  [16])0x0;
                local_4b8 = (undefined1  [16])0x0;
                local_4a8 = (undefined1  [16])0x0;
                local_498 = (undefined1  [16])0x0;
                local_488 = (undefined1  [16])0x0;
                local_478 = SUB1613((undefined1  [16])0x0,0);
                uStack_46b = 0;
                iStack_468 = 0;
                bStack_464 = false;
                boost::multiprecision::default_ops::
                eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                          ((cpp_dec_float<200U,_int,_void> *)local_4d8,
                           (cpp_dec_float<200U,_int,_void> *)local_398,
                           (cpp_dec_float<200U,_int,_void> *)local_438);
                pcVar28 = (cpp_dec_float<200U,_int,_void> *)local_4d8;
                pcVar27 = (cpp_dec_float<200U,_int,_void> *)local_438;
                for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                  (pcVar27->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
                  pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar28 + (ulong)bVar35 * -8 + 4);
                  pcVar27 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar27 + (ulong)bVar35 * -8 + 4);
                }
                iStack_3c8 = iStack_468;
                abStack_3c4[0] = bStack_464;
                local_3c0 = local_460;
                pnVar18 = local_448;
              }
              else {
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                cpp_dec_float<long_long>((cpp_dec_float<200U,_int,_void> *)local_4d8,0,(type *)0x0);
                iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   ((cpp_dec_float<200U,_int,_void> *)local_2e8,
                                    (cpp_dec_float<200U,_int,_void> *)local_4d8);
                if (0 < iVar11) goto LAB_005c988c;
                local_460 = 0x1c00000000;
                local_4d8._0_16_ = (undefined1  [16])0x0;
                local_4d8._16_16_ = (undefined1  [16])0x0;
                local_4b8 = (undefined1  [16])0x0;
                local_4a8 = (undefined1  [16])0x0;
                local_498 = (undefined1  [16])0x0;
                local_488 = (undefined1  [16])0x0;
                local_478 = SUB1613((undefined1  [16])0x0,0);
                uStack_46b = 0;
                iStack_468 = 0;
                bStack_464 = false;
                boost::multiprecision::default_ops::
                eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                          ((cpp_dec_float<200U,_int,_void> *)local_4d8,local_2f8,
                           (cpp_dec_float<200U,_int,_void> *)local_438);
                puVar26 = (uint *)local_4d8;
                pcVar28 = (cpp_dec_float<200U,_int,_void> *)local_438;
                for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                  (pcVar28->data)._M_elems[0] = *puVar26;
                  puVar26 = puVar26 + (ulong)bVar35 * -2 + 1;
                  pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar28 + (ulong)bVar35 * -8 + 4);
                }
                iStack_3c8 = iStack_468;
                abStack_3c4[0] = bStack_464;
                local_3c0 = local_460;
              }
              local_3c0._0_4_ = (fpclass_type)local_460;
              if ((((fpclass_type)local_3c0 != cpp_dec_float_NaN) &&
                  ((fpclass_type)local_160 != cpp_dec_float_NaN)) &&
                 (iStack_3c8 = iStack_468, abStack_3c4[0] = bStack_464, local_3c0 = local_460,
                 iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                    ((cpp_dec_float<200U,_int,_void> *)local_438,
                                     (cpp_dec_float<200U,_int,_void> *)local_1d8), iVar11 < 0)) {
                pcVar28 = (cpp_dec_float<200U,_int,_void> *)local_438;
                puVar26 = (uint *)local_1d8;
                for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                  *puVar26 = (pcVar28->data)._M_elems[0];
                  pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar28 + (ulong)bVar35 * -8 + 4);
                  puVar26 = puVar26 + (ulong)bVar35 * -2 + 1;
                }
                iStack_168 = iStack_3c8;
                bStack_164 = abStack_3c4[0];
                local_160 = local_3c0;
                local_44c = iVar10;
              }
            }
          }
        }
LAB_005c9a70:
        lVar12 = lVar12 + 1;
        lVar33 = lVar33 + 8;
        pnVar19 = (pointer)((long)&pnVar6[1].m_backend.data + lVar17);
        lVar17 = lVar17 + 0x80;
        piVar16 = (int *)pnVar18;
      } while (pnVar19 < local_308);
    }
    (local_3a8->thedelta).super_IdxSet.num =
         (int)((ulong)((long)pnVar18 - (long)(local_3a8->thedelta).super_IdxSet.idx) >> 2);
    (local_3a8->thedelta).setupStatus = true;
  }
  puVar26 = (uint *)local_1d8;
  pnVar18 = local_148;
  for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
    (pnVar18->m_backend).data._M_elems[0] = *puVar26;
    puVar26 = puVar26 + (ulong)bVar35 * -2 + 1;
    pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar18 + ((ulong)bVar35 * -2 + 1) * 4);
  }
  (local_148->m_backend).exp = iStack_168;
  (local_148->m_backend).neg = bStack_164;
  (local_148->m_backend).fpclass = (fpclass_type)local_160;
  (local_148->m_backend).prec_elem = local_160._4_4_;
  pcVar28 = &local_268;
  pnVar18 = local_140;
  for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
    (pnVar18->m_backend).data._M_elems[0] = (pcVar28->data)._M_elems[0];
    pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + ((ulong)bVar35 * -2 + 1) * 4);
    pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar18 + ((ulong)bVar35 * -2 + 1) * 4);
  }
  (local_140->m_backend).exp = local_268.exp;
  (local_140->m_backend).neg = local_268.neg;
  (local_140->m_backend).fpclass = local_268.fpclass;
  (local_140->m_backend).prec_elem = local_268.prec_elem;
  return local_44c;
}

Assistant:

int SPxFastRT<R>::maxDelta(
   R& val,                                /* on return: maximum step length */
   R& maxabs,                             /* on return: maximum absolute value in upd VectorBase<R> */
   UpdateVector<R>& update,
   const VectorBase<R>& lowBound,
   const VectorBase<R>& upBound,
   int start,
   int incr) const
{
   int i, sel;
   R x, y, max;
   R u, l;
   bool leaving = this->m_type == SPxSolverBase<R>::LEAVE;
   bool enterrowrep = !leaving && this->thesolver->theRep == SPxSolverBase<R>::ROW;

   R mabs = maxabs;

   const R* up = upBound.get_const_ptr();
   const R* low = lowBound.get_const_ptr();
   const R* vec = update.get_const_ptr();
   const R* upd = update.delta().values();
   const int* idx = update.delta().indexMem();

   sel = -1;
   max = val;

   if(update.delta().isSetup())
   {
      const int* last = idx + update.delta().size();

      for(idx += start; idx < last; idx += incr)
      {
         i = *idx;

         /* in the dual algorithm, bound flips cannot happen, hence we only consider nonbasic variables */
         if(leaving && ((iscoid && this->thesolver->isCoBasic(i)) || (!iscoid
                        && this->thesolver->isBasic(i))))
            continue;

         if(enterrowrep && this->thesolver->baseId(i).isSPxColId()
               && this->thesolver->desc().colStatus(this->thesolver->number(SPxColId(this->thesolver->baseId(i))))
               == SPxBasisBase<R>::Desc::P_FIXED)
            continue;

         x = upd[i];

         if(x > epsilonZero())
         {
            // @todo check wether mabs should be computed only over bounded vars, i.e., in the if block below
            mabs = (x > mabs) ? x : mabs;
            u = up[i];

            if(u < R(infinity))
            {
               y = u - vec[i];

               if(y <= 0)
                  x = fastDelta / x;
               else
                  x = (y + fastDelta) / x;

               if(x < max)
               {
                  max = x;
                  sel = i;
               }
            }
         }
         else if(x < -epsilonZero())
         {
            // @todo check wether mabs should be computed only over bounded vars, i.e., in the if block below
            mabs = (-x > mabs) ? -x : mabs;
            l = low[i];

            if(l > R(-infinity))
            {
               y = l - vec[i];

               if(y >= 0)
                  x = - fastDelta / x;
               else
                  x = (y - fastDelta) / x;

               if(x < max)
               {
                  max = x;
                  sel = i;
               }
            }
         }
      }
   }
   else
   {
      /* In this case, the indices of the semi-sparse Vector update.delta() are not set up and are filled below. */
      int* l_idx = update.delta().altIndexMem();
      R* uval = update.delta().altValues();
      const R* uend = uval + update.dim();
      assert(uval == upd);

      for(i = 0; uval < uend; ++uval, ++i)
      {
         x = *uval;

         if(x != 0.0)
         {
            if(x >= -epsilonZero() && x <= epsilonZero())
            {
               *uval = 0.0;
               continue;
            }
            else
               *l_idx++ = i;

            /* in the dual algorithm, bound flips cannot happen, hence we only consider nonbasic variables */
            if(leaving && ((iscoid && this->thesolver->isCoBasic(i)) || (!iscoid
                           && this->thesolver->isBasic(i))))
               continue;

            if(enterrowrep && this->thesolver->baseId(i).isSPxColId()
                  && this->thesolver->desc().colStatus(this->thesolver->number(SPxColId(this->thesolver->baseId(i))))
                  == SPxBasisBase<R>::Desc::P_FIXED)
               continue;

            if(x > epsilonZero())
            {
               mabs = (x > mabs) ? x : mabs;
               u = up[i];

               if(u < R(infinity))
               {
                  y = u - vec[i];

                  if(y <= 0)
                     x = fastDelta / x;
                  else
                     x = (y + fastDelta) / x;

                  if(x < max)
                  {
                     max = x;
                     sel = i;
                  }
               }
            }
            else if(x < -epsilonZero())
            {
               mabs = (-x > mabs) ? -x : mabs;
               l = low[i];

               if(l > R(-infinity))
               {
                  y = l - vec[i];

                  if(y >= 0)
                     x = - fastDelta / x;
                  else
                     x = (y - fastDelta) / x;

                  if(x < max)
                  {
                     max = x;
                     sel = i;
                  }
               }
            }
         }
      }

      update.delta().setSize(int(l_idx - update.delta().indexMem()));
      update.delta().forceSetup();
   }

   val = max;
   maxabs = mabs;
   return sel;
}